

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_read_finish_str(nni_ws *ws)

{
  nni_iov *aio_00;
  size_t count;
  size_t local_38;
  size_t n;
  ws_frame *frame;
  nni_iov *pnStack_20;
  uint niov;
  nni_iov *iov;
  nni_aio *aio;
  nni_ws *ws_local;
  
  aio = (nni_aio *)ws;
  while ((iov = (nni_iov *)nni_list_first((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x28)),
         iov != (nni_iov *)0x0 &&
         (n = (size_t)nni_list_first((nni_list *)(aio->a_iov + 2)), (ws_frame *)n != (ws_frame *)0x0
         ))) {
    if (((ws_frame *)n)->len == 0) {
      nni_list_remove((nni_list *)(aio->a_iov + 2),(void *)n);
      ws_frame_fini((ws_frame *)n);
    }
    else {
      nni_aio_list_remove((nni_aio *)iov);
      nni_aio_get_iov((nni_aio *)iov,(uint *)((long)&frame + 4),&stack0xffffffffffffffe0);
      while (aio_00 = iov, n != 0 && frame._4_4_ != 0) {
        local_38 = *(ulong *)(n + 0xa8);
        if (pnStack_20->iov_len < local_38) {
          local_38 = pnStack_20->iov_len;
        }
        if (local_38 != 0) {
          memcpy(pnStack_20->iov_buf,*(void **)(n + 200),local_38);
          pnStack_20->iov_buf = (void *)((long)pnStack_20->iov_buf + local_38);
          pnStack_20->iov_len = pnStack_20->iov_len - local_38;
          if (pnStack_20->iov_len == 0) {
            pnStack_20 = pnStack_20 + 1;
            frame._4_4_ = frame._4_4_ + -1;
          }
        }
        if (*(size_t *)(n + 0xa8) == local_38) {
          nni_list_remove((nni_list *)(aio->a_iov + 2),(void *)n);
          ws_frame_fini((ws_frame *)n);
          n = (size_t)nni_list_first((nni_list *)(aio->a_iov + 2));
        }
        else {
          *(size_t *)(n + 0xa8) = *(long *)(n + 0xa8) - local_38;
          *(size_t *)(n + 200) = local_38 + *(long *)(n + 200);
        }
        nni_aio_bump_count((nni_aio *)iov,local_38);
      }
      count = nni_aio_count((nni_aio *)iov);
      nni_aio_finish((nni_aio *)aio_00,NNG_OK,count);
    }
  }
  return;
}

Assistant:

static void
ws_read_finish_str(nni_ws *ws)
{
	for (;;) {
		nni_aio  *aio;
		nni_iov  *iov;
		unsigned  niov;
		ws_frame *frame;

		if ((aio = nni_list_first(&ws->recvq)) == NULL) {
			return;
		}

		if ((frame = nni_list_first(&ws->rxq)) == NULL) {
			return;
		}

		// Discard 0 length frames -- in stream mode they are not used.
		if (frame->len == 0) {
			nni_list_remove(&ws->rxq, frame);
			ws_frame_fini(frame);
			continue;
		}

		// We are completing this aio one way or the other.
		nni_aio_list_remove(aio);
		nni_aio_get_iov(aio, &niov, &iov);

		while ((frame != NULL) && (niov != 0)) {
			size_t n;

			if ((n = frame->len) > iov->iov_len) {
				// This eats the entire iov.
				n = iov->iov_len;
			}
			if (n != 0) {
				memcpy(iov->iov_buf, frame->buf, n);
				iov->iov_buf = ((uint8_t *) iov->iov_buf) + n;
				iov->iov_len -= n;
				if (iov->iov_len == 0) {
					iov++;
					niov--;
				}
			}

			if (frame->len == n) {
				nni_list_remove(&ws->rxq, frame);
				ws_frame_fini(frame);
				frame = nni_list_first(&ws->rxq);
			} else {
				frame->len -= n;
				frame->buf += n;
			}

			nni_aio_bump_count(aio, n);
		}

		nni_aio_finish(aio, 0, nni_aio_count(aio));
	}
}